

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readfile.h
# Opt level: O3

char * readfile(char *filename,size_t max_size,size_t *size_out)

{
  ulong uVar1;
  FILE *__stream;
  ulong uVar2;
  char *__ptr;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    uVar5 = 0;
LAB_00104641:
    __ptr = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    uVar5 = 0;
    if (-1 < (long)uVar2) {
      if (max_size != 0) {
        *(ulong *)max_size = uVar2;
      }
      uVar5 = uVar2;
      if (uVar2 < 0x2801) {
        rewind(__stream);
        __ptr = (char *)malloc(uVar2 + (uVar2 == 0));
        if (__ptr != (char *)0x0) {
          uVar1 = 0;
          do {
            uVar4 = uVar1;
            sVar3 = fread(__ptr + uVar4,1,uVar2 - uVar4,__stream);
            uVar1 = sVar3 + uVar4;
          } while (sVar3 != 0);
          fclose(__stream);
          if (uVar2 == uVar4) goto LAB_00104657;
          free(__ptr);
          goto LAB_00104641;
        }
      }
    }
    fclose(__stream);
    __ptr = (char *)0x0;
  }
LAB_00104657:
  if (max_size != 0) {
    *(ulong *)max_size = uVar5;
  }
  return __ptr;
}

Assistant:

static char *readfile(const char *filename, size_t max_size, size_t *size_out)
{
    FILE *fp;
    long k;
    size_t size, pos, n, _out;
    char *buf;

    size_out = size_out ? size_out : &_out;

    fp = fopen(filename, "rb");
    size = 0;
    buf = 0;

    if (!fp) {
        goto fail;
    }
    fseek(fp, 0L, SEEK_END);
    k = ftell(fp);
    if (k < 0) goto fail;
    size = (size_t)k;
    *size_out = size;
    if (max_size > 0 && size > max_size) {
        goto fail;
    }
    rewind(fp);
    buf = (char *)malloc(size ? size : 1);
    if (!buf) {
        goto fail;
    }
    pos = 0;
    while ((n = fread(buf + pos, 1, size - pos, fp))) {
        pos += n;
    }
    if (pos != size) {
        goto fail;
    }
    fclose(fp);
    *size_out = size;
    return buf;

fail:
    if (fp) {
        fclose(fp);
    }
    if (buf) {
        free(buf);
    }
    *size_out = size;
    return 0;
}